

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_data.cpp
# Opt level: O0

void __thiscall
ximu::RegisterData::RegisterData(RegisterData *this,unsigned_short address,unsigned_short value)

{
  bool bVar1;
  unsigned_short value_local;
  unsigned_short address_local;
  RegisterData *this_local;
  
  this->_value = value;
  bVar1 = Utility::isWithinInclIncl<ximu::reg::RegisterAddresses,unsigned_short>
                    (FIRMWARE_VERSION_MAJOR_NUM,NUM_REGISTERS,value);
  if (bVar1) {
    this->_address = (uint)address;
  }
  return;
}

Assistant:

RegisterData::RegisterData(unsigned short address,
                           unsigned short value)
    :
    _value(value) {
  // check if address falls within the enum
  if (Utility::isWithinInclIncl(
          reg::RegisterAddresses::FIRMWARE_VERSION_MAJOR_NUM,
          reg::RegisterAddresses::NUM_REGISTERS,
          value)
      ) {
    _address = static_cast<reg::RegisterAddresses>(address);
  }
}